

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::MessageFieldGenerator::MessageFieldGenerator
          (MessageFieldGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  Options *options_local;
  FieldDescriptor *descriptor_local;
  MessageFieldGenerator *this_local;
  
  FieldGenerator::FieldGenerator(&this->super_FieldGenerator);
  (this->super_FieldGenerator)._vptr_FieldGenerator =
       (_func_int **)&PTR__MessageFieldGenerator_00410368;
  this->descriptor_ = descriptor;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->variables_);
  anon_unknown_3::SetMessageVariables(descriptor,&this->variables_,options);
  return;
}

Assistant:

MessageFieldGenerator::
MessageFieldGenerator(const FieldDescriptor* descriptor,
                      const Options& options)
  : descriptor_(descriptor) {
  SetMessageVariables(descriptor, &variables_, options);
}